

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_namedparams::test_method(rpc_namedparams *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  string_view json;
  string_view json_00;
  string_view json_01;
  string_view json_02;
  string_view json_03;
  string_view json_04;
  string_view json_05;
  bool bVar1;
  lazy_ostream *plVar2;
  long in_FS_OFFSET;
  UniValue *ex_2;
  UniValue *ex_1;
  UniValue *ex;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names;
  char *in_stack_fffffffffffff1a8;
  char *in_stack_fffffffffffff1b0;
  char *in_stack_fffffffffffff1b8;
  char *in_stack_fffffffffffff1c0;
  undefined7 in_stack_fffffffffffff1c8;
  undefined1 in_stack_fffffffffffff1cf;
  lazy_ostream *in_stack_fffffffffffff1d0;
  char (*in_stack_fffffffffffff1d8) [5];
  char *line_num;
  undefined7 in_stack_fffffffffffff1e0;
  undefined1 in_stack_fffffffffffff1e7;
  lazy_ostream *in_stack_fffffffffffff1e8;
  undefined8 in_stack_fffffffffffff1f0;
  undefined6 in_stack_fffffffffffff1f8;
  undefined1 in_stack_fffffffffffff1fe;
  undefined1 in_stack_fffffffffffff1ff;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_fffffffffffff200;
  UniValue *in_stack_fffffffffffff208;
  RPCTestingSetup *in_stack_fffffffffffff210;
  size_t in_stack_fffffffffffff290;
  char *in_stack_fffffffffffff298;
  char *pcVar3;
  long *local_cc8;
  undefined1 local_c18 [16];
  undefined1 local_c08 [104];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [176];
  const_string local_ae0;
  lazy_ostream local_ad0 [2];
  assertion_result local_ab0 [10];
  const_string local_9c0;
  lazy_ostream local_9b0 [2];
  assertion_result local_990 [7];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [176];
  const_string local_828;
  lazy_ostream local_818 [2];
  assertion_result local_7f8 [7];
  undefined1 local_750 [16];
  undefined1 local_740 [67];
  undefined1 local_6fd;
  undefined1 local_6fc;
  undefined1 local_6fb;
  undefined1 local_6fa;
  undefined1 local_6f9;
  undefined1 local_688 [88];
  UniValue local_630;
  undefined1 local_5b8 [88];
  UniValue local_560 [6];
  undefined1 local_308 [88];
  UniValue local_2b0 [4];
  undefined1 local_148 [88];
  UniValue local_f0 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6f9 = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,(bool *)in_stack_fffffffffffff1d0);
  local_6fa = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,(bool *)in_stack_fffffffffffff1d0);
  local_6fb = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,(bool *)in_stack_fffffffffffff1d0);
  local_6fc = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,(bool *)in_stack_fffffffffffff1d0);
  local_6fd = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,(bool *)in_stack_fffffffffffff1d0);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               *)in_stack_fffffffffffff1a8);
  __l._M_len._0_6_ = in_stack_fffffffffffff1f8;
  __l._M_array = (iterator)in_stack_fffffffffffff1f0;
  __l._M_len._6_1_ = in_stack_fffffffffffff1fe;
  __l._M_len._7_1_ = in_stack_fffffffffffff1ff;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)in_stack_fffffffffffff1e8,__l,
           (allocator_type *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0));
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                *)in_stack_fffffffffffff1a8);
  local_cc8 = &local_8;
  do {
    local_cc8 = local_cc8 + -5;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)in_stack_fffffffffffff1a8);
  } while (local_cc8 != (long *)((long)&local_f0[0].val.field_2 + 8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [1])in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json._M_str = in_stack_fffffffffffff298;
    json._M_len = in_stack_fffffffffffff290;
    JSON(json);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::write_abi_cxx11_(local_f0,(int)local_148,(void *)0x0,0);
    in_stack_fffffffffffff1b8 = "\"[null,2,null,4]\"";
    in_stack_fffffffffffff1b0 = "[null,2,null,4]";
    in_stack_fffffffffffff1a8 =
         "TransformParams(JSON(R\"({\"arg2\": 2, \"arg4\": 4})\"), arg_names).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
              (local_740,local_750,0x5c,1,2,local_f0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1a8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json_00._M_str = in_stack_fffffffffffff298;
    json_00._M_len = in_stack_fffffffffffff290;
    JSON(json_00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 (unsigned_long)in_stack_fffffffffffff1a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1e8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
                 (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff1b8,
                 SUB81((ulong)in_stack_fffffffffffff1b0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [43])in_stack_fffffffffffff1a8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 (unsigned_long)in_stack_fffffffffffff1a8);
      in_stack_fffffffffffff1a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_7f8,local_818,&local_828,0x60,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_fffffffffffff1a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff1a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [1])in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json_01._M_str = pcVar3;
    json_01._M_len = (size_t)plVar2;
    JSON(json_01);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::write_abi_cxx11_(local_2b0,(int)local_308,(void *)0x0,0);
    in_stack_fffffffffffff1b8 = "\"[1,2,null,4,5]\"";
    in_stack_fffffffffffff1b0 = "[1,2,null,4,5]";
    in_stack_fffffffffffff1a8 =
         "TransformParams(JSON(R\"({\"arg5\": 5, \"args\": [1, 2], \"arg4\": 4})\"), arg_names).write()"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
              (local_8d8,local_8e8,99,1,2,local_2b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1a8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json_02._M_str = pcVar3;
    json_02._M_len = (size_t)plVar2;
    JSON(json_02);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 (unsigned_long)in_stack_fffffffffffff1a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1e8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
                 (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff1b8,
                 SUB81((ulong)in_stack_fffffffffffff1b0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [43])in_stack_fffffffffffff1a8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 (unsigned_long)in_stack_fffffffffffff1a8);
      in_stack_fffffffffffff1a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_990,local_9b0,&local_9c0,0x67,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_fffffffffffff1a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff1a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json_03._M_str = pcVar3;
    json_03._M_len = (size_t)plVar2;
    JSON(json_03);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 (unsigned_long)in_stack_fffffffffffff1a8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff1e8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
                 (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff1b8,
                 SUB81((ulong)in_stack_fffffffffffff1b0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [43])in_stack_fffffffffffff1a8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                 (unsigned_long)in_stack_fffffffffffff1a8);
      in_stack_fffffffffffff1a8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_ab0,local_ad0,&local_ae0,0x6b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                          *)in_stack_fffffffffffff1a8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff1a8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    in_stack_fffffffffffff1fe = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff1fe);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)in_stack_fffffffffffff1d8,(const_string *)in_stack_fffffffffffff1d0);
    in_stack_fffffffffffff1e8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [1])in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json_04._M_str = pcVar3;
    json_04._M_len = (size_t)plVar2;
    JSON(json_04);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::write_abi_cxx11_(local_560,(int)local_5b8,(void *)0x0,0);
    in_stack_fffffffffffff1b8 = "\"[1,2,3,4,5,6,7,8,9,10]\"";
    in_stack_fffffffffffff1b0 = "[1,2,3,4,5,6,7,8,9,10]";
    in_stack_fffffffffffff1a8 =
         "TransformParams(JSON(R\"({\"args\": [1,2,3,4,5,6,7,8,9,10]})\"), arg_names).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[23]>
              (local_b90,local_ba0,0x6e,1,2,local_560);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1a8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1a8);
    in_stack_fffffffffffff1e7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff1e7);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff1e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0),
               (size_t)line_num,(const_string *)in_stack_fffffffffffff1d0);
    in_stack_fffffffffffff1d0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff1b0,(char (*) [1])in_stack_fffffffffffff1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               (unsigned_long)in_stack_fffffffffffff1a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c0);
    json_05._M_str = pcVar3;
    json_05._M_len = (size_t)plVar2;
    JSON(json_05);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector(in_stack_fffffffffffff200,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_fffffffffffff1ff,
                         CONCAT16(in_stack_fffffffffffff1fe,in_stack_fffffffffffff1f8)));
    RPCTestingSetup::TransformParams
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
    UniValue::write_abi_cxx11_(&local_630,(int)local_688,(void *)0x0,0);
    in_stack_fffffffffffff1b8 = "\"[1,2,3,4,5,6,7,8,9,10]\"";
    in_stack_fffffffffffff1b0 = "[1,2,3,4,5,6,7,8,9,10]";
    in_stack_fffffffffffff1a8 =
         "TransformParams(JSON(R\"([1,2,3,4,5,6,7,8,9,10])\"), arg_names).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[23]>
              (local_c08,local_c18,0x6f,1,2,&local_630);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1a8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_fffffffffffff1b8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff1a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1a8);
    in_stack_fffffffffffff1cf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff1cf);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)in_stack_fffffffffffff1b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_namedparams)
{
    const std::vector<std::pair<std::string, bool>> arg_names{{"arg1", false}, {"arg2", false}, {"arg3", false}, {"arg4", false}, {"arg5", false}};

    // Make sure named arguments are transformed into positional arguments in correct places separated by nulls
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg2": 2, "arg4": 4})"), arg_names).write(), "[null,2,null,4]");

    // Make sure named argument specified multiple times raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg2": 2, "arg2": 4})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter arg2 specified multiple times"})"));

    // Make sure named and positional arguments can be combined.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg5": 5, "args": [1, 2], "arg4": 4})"), arg_names).write(), "[1,2,null,4,5]");

    // Make sure a unknown named argument raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg2": 2, "unknown": 6})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Unknown named parameter unknown"})"));

    // Make sure an overlap between a named argument and positional argument raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"args": [1,2,3], "arg4": 4, "arg2": 2})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter arg2 specified twice both as positional and named argument"})"));

    // Make sure extra positional arguments can be passed through to the method implementation, as long as they don't overlap with named arguments.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"args": [1,2,3,4,5,6,7,8,9,10]})"), arg_names).write(), "[1,2,3,4,5,6,7,8,9,10]");
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"([1,2,3,4,5,6,7,8,9,10])"), arg_names).write(), "[1,2,3,4,5,6,7,8,9,10]");
}